

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

BranchInstr * __thiscall IR::Instr::ChangeCmCCToBranchInstr(Instr *this,LabelInstr *targetInstr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BranchInstr *instr;
  Opnd *pOVar5;
  BranchInstr *instrBr;
  OpCode newOpcode;
  LabelInstr *targetInstr_local;
  Instr *this_local;
  
  instrBr._6_2_ = InvalidOpCode;
  OVar1 = this->m_opcode;
  if (OVar1 == CmEq_A) {
    instrBr._6_2_ = BrEq_A;
  }
  else if (OVar1 == CmGe_A) {
    instrBr._6_2_ = BrGe_A;
  }
  else if (OVar1 == CmGt_A) {
    instrBr._6_2_ = BrGt_A;
  }
  else if (OVar1 == CmLt_A) {
    instrBr._6_2_ = BrLt_A;
  }
  else if (OVar1 == CmLe_A) {
    instrBr._6_2_ = BrLe_A;
  }
  else if (OVar1 == CmNeq_A) {
    instrBr._6_2_ = BrNeq_A;
  }
  else if (OVar1 == CmSrEq_A) {
    instrBr._6_2_ = BrSrEq_A;
  }
  else if (OVar1 == CmSrNeq_A) {
    instrBr._6_2_ = BrSrNeq_A;
  }
  else if (OVar1 == CmUnGe_A) {
    instrBr._6_2_ = BrUnGe_A;
  }
  else if (OVar1 == CmUnGt_A) {
    instrBr._6_2_ = BrUnGt_A;
  }
  else if (OVar1 == CmUnLt_A) {
    instrBr._6_2_ = BrUnLt_A;
  }
  else if (OVar1 == CmUnLe_A) {
    instrBr._6_2_ = BrUnLe_A;
  }
  else if (OVar1 == CmEq_I4) {
    instrBr._6_2_ = BrEq_I4;
  }
  else if (OVar1 == CmNeq_I4) {
    instrBr._6_2_ = BrNeq_I4;
  }
  else if (OVar1 == CmLt_I4) {
    instrBr._6_2_ = BrLt_I4;
  }
  else if (OVar1 == CmLe_I4) {
    instrBr._6_2_ = BrLe_I4;
  }
  else if (OVar1 == CmGt_I4) {
    instrBr._6_2_ = BrGt_I4;
  }
  else if (OVar1 == CmGe_I4) {
    instrBr._6_2_ = BrGe_I4;
  }
  else if (OVar1 == CmUnLt_I4) {
    instrBr._6_2_ = BrUnLt_I4;
  }
  else if (OVar1 == CmUnLe_I4) {
    instrBr._6_2_ = BrUnLe_I4;
  }
  else if (OVar1 == CmUnGt_I4) {
    instrBr._6_2_ = BrUnGt_I4;
  }
  else if (OVar1 == CmUnGe_I4) {
    instrBr._6_2_ = BrUnGe_I4;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xf50,"((0))","UNREACHED");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  instr = BranchInstr::New(instrBr._6_2_,targetInstr,this->m_func);
  InsertBefore(this,&instr->super_Instr);
  SetByteCodeOffset(&instr->super_Instr,this);
  pOVar5 = UnlinkSrc1(this);
  SetSrc1(&instr->super_Instr,pOVar5);
  pOVar5 = UnlinkSrc2(this);
  SetSrc2(&instr->super_Instr,pOVar5);
  Remove(this);
  return instr;
}

Assistant:

BranchInstr *
Instr::ChangeCmCCToBranchInstr(LabelInstr *targetInstr)
{
    Js::OpCode newOpcode = Js::OpCode::InvalidOpCode;
    switch (this->m_opcode)
    {
    case Js::OpCode::CmEq_A:
        newOpcode = Js::OpCode::BrEq_A;
        break;
    case Js::OpCode::CmGe_A:
        newOpcode = Js::OpCode::BrGe_A;
        break;
    case Js::OpCode::CmGt_A:
        newOpcode = Js::OpCode::BrGt_A;
        break;
    case Js::OpCode::CmLt_A:
        newOpcode = Js::OpCode::BrLt_A;
        break;
    case Js::OpCode::CmLe_A:
        newOpcode = Js::OpCode::BrLe_A;
        break;
    case Js::OpCode::CmUnGe_A:
        newOpcode = Js::OpCode::BrUnGe_A;
        break;
    case Js::OpCode::CmUnGt_A:
        newOpcode = Js::OpCode::BrUnGt_A;
        break;
    case Js::OpCode::CmUnLt_A:
        newOpcode = Js::OpCode::BrUnLt_A;
        break;
    case Js::OpCode::CmUnLe_A:
        newOpcode = Js::OpCode::BrUnLe_A;
        break;
    case Js::OpCode::CmNeq_A:
        newOpcode = Js::OpCode::BrNeq_A;
        break;
    case Js::OpCode::CmSrEq_A:
        newOpcode = Js::OpCode::BrSrEq_A;
        break;
    case Js::OpCode::CmSrNeq_A:
        newOpcode = Js::OpCode::BrSrNeq_A;
        break;
    case Js::OpCode::CmEq_I4:
        newOpcode = Js::OpCode::BrEq_I4;
        break;
    case Js::OpCode::CmGe_I4:
        newOpcode = Js::OpCode::BrGe_I4;
        break;
    case Js::OpCode::CmGt_I4:
        newOpcode = Js::OpCode::BrGt_I4;
        break;
    case Js::OpCode::CmLt_I4:
        newOpcode = Js::OpCode::BrLt_I4;
        break;
    case Js::OpCode::CmLe_I4:
        newOpcode = Js::OpCode::BrLe_I4;
        break;
    case Js::OpCode::CmUnGe_I4:
        newOpcode = Js::OpCode::BrUnGe_I4;
        break;
    case Js::OpCode::CmUnGt_I4:
        newOpcode = Js::OpCode::BrUnGt_I4;
        break;
    case Js::OpCode::CmUnLt_I4:
        newOpcode = Js::OpCode::BrUnLt_I4;
        break;
    case Js::OpCode::CmUnLe_I4:
        newOpcode = Js::OpCode::BrUnLe_I4;
        break;
    case Js::OpCode::CmNeq_I4:
        newOpcode = Js::OpCode::BrNeq_I4;
        break;
    default:
        Assert(UNREACHED);
        __assume(UNREACHED);
    }

    BranchInstr *instrBr = BranchInstr::New(newOpcode, targetInstr, this->m_func);
    this->InsertBefore(instrBr);
    instrBr->SetByteCodeOffset(this);
    instrBr->SetSrc1(this->UnlinkSrc1());
    instrBr->SetSrc2(this->UnlinkSrc2());

    this->Remove();

    return instrBr;
}